

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O3

void __thiscall ValidateVulnerability::ReadVulnerabilityFile(ValidateVulnerability *this)

{
  Validate *this_00;
  int *piVar1;
  uint uVar2;
  uint uVar3;
  Vulnerability *__k;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *this_01;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  mapped_type *pmVar7;
  const_iterator __position;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  OASIS_FLOAT *pOVar12;
  Validate *pVVar13;
  OASIS_FLOAT local_94;
  Validate *local_90;
  int *local_88;
  int *local_80;
  _Alloc_node local_78;
  Vulnerability *local_70;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_68;
  _Base_ptr local_60;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *local_58;
  int *local_50;
  OASIS_FLOAT *local_48;
  char *local_40;
  longlong *local_38;
  
  local_94 = 0.0;
  ReadFirstVulnerabilityLine(this,&local_94);
  if (this->convertToBin_ == true) {
    (**this->_vptr_ValidateVulnerability)(this);
  }
  this_00 = &this->super_Validate;
  pcVar6 = fgets(this_00->line_,0x1000,_stdin);
  if (pcVar6 != (char *)0x0) {
    local_38 = &this->initialVulID_;
    local_88 = &(this->v_).intensity_bin_id;
    piVar11 = &(this->v_).damage_bin_id;
    pOVar12 = &(this->v_).probability;
    local_80 = &(this->super_Validate).lineno_;
    local_40 = this->vulIDName_;
    local_70 = &this->v_;
    local_90 = (Validate *)this->prevLine_;
    local_58 = &this->vulIDToIntBinIDs_;
    local_60 = &(this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_68 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->intensityBinIDs_;
    local_50 = piVar11;
    local_48 = pOVar12;
    do {
      iVar4 = __isoc99_sscanf(this_00,"%lld,%d,%d,%f",local_38,local_88,piVar11,pOVar12);
      if (iVar4 == 4) {
        uVar5 = Validate::CheckIDDoesNotExceedMaxLimit(this_00,local_40,this->initialVulID_);
        (this->v_).vulnerability_id = uVar5;
        uVar9 = (ulong)(uint)this->prevVulID_;
        if ((int)uVar5 < this->prevVulID_) {
          uVar2 = (this->super_Validate).lineno_;
          fprintf(_stderr,
                  "ERROR: Vulnerability IDs %d and %d in lines %d and %d respectively are not in ascending order:\n%s\n%s\n"
                  ,uVar9,(ulong)uVar5,(ulong)(uVar2 - 1),(ulong)uVar2,this_00,local_90);
          Validate::PrintErrorMessage(this_00);
          uVar5 = (this->v_).vulnerability_id;
          uVar9 = (ulong)(uint)this->prevVulID_;
        }
        if ((uVar5 == (uint)uVar9) && ((this->v_).intensity_bin_id == this->prevIntBinID_)) {
          local_94 = local_94 + (this->v_).probability;
          uVar9 = (ulong)(uint)this->prevDamageBinID_;
        }
        else {
          if ((int)(local_94 * 10000.0 + 0.5) != 10000) {
            fprintf(_stderr,
                    "ERROR: Probabilities for vulnerability ID %d and intensity bin ID %d do not sum to 1.0 (total probability = %f).\n"
                    ,(double)local_94,uVar9,(ulong)(uint)this->prevIntBinID_);
            Validate::PrintErrorMessage(this_00);
            uVar5 = (this->v_).vulnerability_id;
            uVar9 = (ulong)(uint)this->prevVulID_;
          }
          if (uVar5 == (uint)uVar9) {
            uVar5 = (this->v_).intensity_bin_id;
            if (uVar5 - 1 != this->prevIntBinID_) {
              fprintf(_stderr,
                      "ERROR: Non-contiguous intensity bin IDs %d on line %d and %d on line %d:\n%s\n%s\n"
                      ,(ulong)(uint)this->prevIntBinID_,(ulong)(*local_80 - 1),(ulong)uVar5,
                      (ulong)(uint)*local_80,local_90,this_00);
              Validate::PrintErrorMessage(this_00);
            }
          }
          this_01 = local_58;
          __k = local_70;
          if (this->allIntensityBinsCheck_ == true) {
            pmVar7 = std::
                     map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                     ::operator[](local_58,&local_70->vulnerability_id);
            local_78._M_t =
                 &std::
                  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                  ::operator[](this_01,&__k->vulnerability_id)->_M_t;
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique_<int_const&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       local_78._M_t,(const_iterator)&(pmVar7->_M_t)._M_impl.super__Rb_tree_header,
                       local_88,&local_78);
            iVar4 = (this->v_).intensity_bin_id;
            lVar10 = (long)iVar4;
            __position._M_node = local_60;
            if (iVar4 <= (int)(this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count) {
              __position._M_node =
                   (this->intensityBinIDs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              if (iVar4 < 1) {
                if (iVar4 != 0) {
                  do {
                    __position._M_node = (_Base_ptr)std::_Rb_tree_decrement(__position._M_node);
                    lVar10 = lVar10 + 1;
                  } while (lVar10 != 0);
                }
              }
              else {
                do {
                  __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
                  lVar10 = lVar10 + -1;
                } while (lVar10 != 0);
              }
            }
            local_78._M_t =
                 (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_68;
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique_<int_const&,std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::_Alloc_node>
                      (local_68,__position,local_88,&local_78);
            piVar11 = local_50;
            pOVar12 = local_48;
          }
          if ((this->useIndexFile_ == true) && ((this->v_).vulnerability_id != this->prevVulID_)) {
            (*this->_vptr_ValidateVulnerability[1])(this);
          }
          this->prevDamageBinID_ = 0;
          local_94 = (this->v_).probability;
          uVar9 = 0;
        }
        uVar5 = *piVar11;
        if (uVar5 - 1 != (int)uVar9) {
          uVar2 = *local_80;
          if ((int)uVar9 == 0) {
            pcVar6 = 
            "ERROR: First damage bin ID (damage bin ID = %d) on line %d is not 1 for vulnerability ID %d and intensity bin ID %d:\n%s\n"
            ;
            uVar9 = (ulong)uVar5;
            uVar3 = uVar2;
            uVar5 = local_70->vulnerability_id;
            uVar2 = *local_88;
            pVVar13 = this_00;
          }
          else {
            uVar3 = uVar2 - 1;
            pcVar6 = 
            "ERROR: Non-contiguous damage bin IDs %d on line %d and %d on line %d:\n%s\n%s\n";
            pVVar13 = local_90;
          }
          fprintf(_stderr,pcVar6,uVar9,(ulong)uVar3,(ulong)uVar5,(ulong)uVar2,pVVar13);
          Validate::PrintErrorMessage(this_00);
        }
        if (this->convertToBin_ == true) {
          (**this->_vptr_ValidateVulnerability)(this);
        }
        piVar1 = &(this->super_Validate).lineno_;
        *piVar1 = *piVar1 + 1;
        iVar4 = (this->v_).intensity_bin_id;
        this->prevVulID_ = (this->v_).vulnerability_id;
        this->prevIntBinID_ = iVar4;
        iVar4 = (this->v_).damage_bin_id;
        this->prevDamageBinID_ = iVar4;
        if (this->maxDamageBin_ < iVar4) {
          this->maxDamageBin_ = iVar4;
        }
        sVar8 = strlen(this_00->line_);
        pVVar13 = local_90;
        memcpy(local_90,this_00,sVar8 + 1);
        sVar8 = strlen(this_00->line_);
        pVVar13->line_[sVar8 - 1] = '\0';
      }
      else {
        ReadVulnerabilityFile();
      }
      pcVar6 = fgets(this_00->line_,0x1000,_stdin);
    } while (pcVar6 != (char *)0x0);
  }
  if ((int)(local_94 * 10000.0 + 0.5) != 10000) {
    ReadVulnerabilityFile();
  }
  if ((this->v_).vulnerability_id == this->prevVulID_) {
    uVar5 = (this->v_).intensity_bin_id;
    uVar2 = this->prevIntBinID_;
    if (uVar5 - 1 != uVar2 && uVar5 != uVar2) {
      uVar3 = (this->super_Validate).lineno_;
      fprintf(_stderr,
              "ERROR: Non-contiguous intensity bin IDs %d on line %d and %d on line %d:\n%s\n%s\n",
              (ulong)uVar2,(ulong)(uVar3 - 1),(ulong)uVar5,(ulong)uVar3,this->prevLine_,this_00);
      Validate::PrintErrorMessage(this_00);
    }
  }
  if (this->useIndexFile_ == true) {
    (*this->_vptr_ValidateVulnerability[1])(this);
  }
  if (this->allIntensityBinsCheck_ == true) {
    CheckAllIntensityBinsPresent(this);
  }
  return;
}

Assistant:

void ValidateVulnerability::ReadVulnerabilityFile() {

  OASIS_FLOAT totalProbability = 0.0;
  ReadFirstVulnerabilityLine(totalProbability);
  // Write first vulnerability line
  if (convertToBin_) WriteBinVulnerabilityFile();

  while (fgets(line_, sizeof(line_), stdin) != 0) {

    if (ScanLine() == 4) {

      CheckVulnerabilityID();

      // New vulnerability and/or intensity bin IDs.
      // Check probabilities sum to 1.0  for each vulnerability ID-intensity
      // bin ID combination and intensity bin IDs are contiguous.
      if ((v_.vulnerability_id != prevVulID_) ||
	  (v_.intensity_bin_id != prevIntBinID_)) {

        CheckProbability(totalProbability);
	if (v_.vulnerability_id == prevVulID_) CheckIntensityBinID();
	if (allIntensityBinsCheck_) SetIntensityBinIDs();
	
	if (useIndexFile_) {
	  if (v_.vulnerability_id != prevVulID_) {

	// if new vulnerability ID then write to index file if requested on
	// command line
	  WriteIdxVulnerabilityFile();

	  }
	}

	// Reset for next vulnerability-intensity bin combination
	prevDamageBinID_ = 0;
	totalProbability = v_.probability;

      } else {   // Only damage bin ID changes

	totalProbability += v_.probability;

      }

      CheckDamageBinID();

      if (convertToBin_) {

        WriteBinVulnerabilityFile();

      }

      StoreLine();
      continue;

    }

    fprintf(stderr, "ERROR: Invalid data in line %d:\n%s\n", lineno_, line_);
    PrintErrorMessage();

  }

  // Check probabilities sum to 1.0 for last vulnerability ID-intensity bin ID
  // combination and intensity bin IDs are contguous.
  CheckProbability(totalProbability);
  if ((v_.vulnerability_id == prevVulID_) &&
      (v_.intensity_bin_id != prevIntBinID_)) CheckIntensityBinID();
  // Write last event to index file if requested on command line
  if (useIndexFile_) WriteIdxVulnerabilityFile();

  if (allIntensityBinsCheck_) CheckAllIntensityBinsPresent();

}